

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O2

int qt_gl_resolve_features(void)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  OpenGLContextProfile OVar5;
  QOpenGLContext *this;
  pair<int,_int> pVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  pair<int,_int> local_a8;
  QSurfaceFormat format;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_70;
  QArrayDataPointer<char> local_58;
  QOpenGLExtensionMatcher extensions;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = QOpenGLContext::currentContext();
  extensions.m_extensions.q_hash.d = (QSet<QByteArray>)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher(&extensions);
  QByteArray::QByteArray((QByteArray *)&local_58,"GL_KHR_blend_equation_advanced",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
  if (bVar2) {
LAB_004d743f:
    QByteArray::QByteArray((QByteArray *)&local_88,"GL_KHR_blend_equation_advanced_coherent",-1);
    bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_88);
    uVar8 = 1;
    if (!bVar3) {
      QByteArray::QByteArray((QByteArray *)&format,"GL_NV_blend_equation_advanced_coherent",-1);
      bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&format);
      uVar8 = (uint)bVar3;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&format);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
    if (!bVar2) goto LAB_004d74aa;
  }
  else {
    QByteArray::QByteArray((QByteArray *)&local_70,"GL_NV_blend_equation_advanced",-1);
    bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_70);
    if (bVar3) goto LAB_004d743f;
    uVar8 = 0;
LAB_004d74aa:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  uVar8 = uVar8 << 0x11;
  bVar2 = QOpenGLContext::isOpenGLES(this);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_IMG_texture_npot",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_OES_texture_npot",-1);
    bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar9 = 0x3fff;
    if (!bVar3) {
      uVar9 = (uint)bVar2 << 0xc | 0xfff;
    }
    QOpenGLContext::format((QOpenGLContext *)&local_88);
    iVar4 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_88);
    bVar2 = true;
    if (iVar4 < 3) {
      QByteArray::QByteArray((QByteArray *)&local_58,"GL_EXT_texture_rg",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_88);
    uVar7 = uVar9 | uVar8 | 0x8000;
    if (bVar2 == false) {
      uVar7 = uVar9 | uVar8;
    }
    QOpenGLContext::format((QOpenGLContext *)&local_58);
    iVar4 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_58);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
    if (2 < iVar4) {
      QOpenGLContext::format((QOpenGLContext *)&local_88);
      iVar4 = QSurfaceFormat::minorVersion((QSurfaceFormat *)&local_88);
      uVar8 = 0x10000;
      if (1 < iVar4) {
        QByteArray::QByteArray((QByteArray *)&local_58,"GL_KHR_blend_equation_advanced_coherent",-1)
        ;
        bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                          ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58
                          );
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        uVar8 = (uint)bVar2 << 0x11 | 0x10000;
      }
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_88);
      uVar7 = uVar7 | uVar8;
    }
    goto LAB_004d795a;
  }
  format.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::currentContext();
  QOpenGLContext::format((QOpenGLContext *)&format);
  iVar4 = QSurfaceFormat::majorVersion(&format);
  if (iVar4 < 3) {
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_EXT_framebuffer_object",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    uVar9 = 0x18008;
    if (!bVar2) {
      QByteArray::QByteArray((QByteArray *)&local_88,"GL_ARB_framebuffer_object",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_88);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
      uVar9 = 0x8000;
      if (bVar2) {
        uVar9 = 0x18008;
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar8 = uVar9 | uVar8;
  }
  else {
    uVar8 = uVar8 | 0x18008;
  }
  iVar4 = QSurfaceFormat::majorVersion(&format);
  if (iVar4 < 2) {
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_ARB_multitexture",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_ARB_shader_objects",-1);
    bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar9 = uVar8 | bVar2 | 2;
    if (!bVar3) {
      uVar9 = uVar8 | bVar2;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_EXT_blend_color",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar8 = uVar9 | 0x10;
    if (!bVar2) {
      uVar8 = uVar9;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_EXT_blend_equation_separate",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar9 = uVar8 | 0x40;
    if (!bVar2) {
      uVar9 = uVar8;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_EXT_blend_subtract",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar8 = uVar9 | 0x100;
    if (!bVar2) {
      uVar8 = uVar9;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_EXT_blend_func_separate",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar9 = uVar8 | 0x80;
    if (!bVar2) {
      uVar9 = uVar8;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_ARB_texture_compression",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar8 = uVar9 | 0x200;
    if (!bVar2) {
      uVar8 = uVar9;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_ARB_multisample",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar9 = uVar8 | 0x400;
    if (!bVar2) {
      uVar9 = uVar8;
    }
    QByteArray::QByteArray((QByteArray *)&local_58,"GL_ARB_texture_non_power_of_two",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    uVar7 = uVar9 | 0x3000;
    if (!bVar2) {
      uVar7 = uVar9;
    }
  }
  else {
    uVar7 = uVar8 | 0x3ff7;
  }
  pVar6 = QSurfaceFormat::version(&format);
  local_88.d = (Data *)pVar6;
  if (pVar6.first < 3) {
LAB_004d794a:
    uVar7 = uVar7 | 0x4000;
  }
  else {
    if (pVar6.first == 3) {
      if (((long)pVar6 < 0) ||
         (((ulong)pVar6 >> 0x20 == 0 &&
          (bVar2 = QSurfaceFormat::testOption(&format,DeprecatedFunctions), bVar2))))
      goto LAB_004d794a;
      if (((ulong)pVar6 & 0x7fffffff00000000) != 0x100000000) goto LAB_004d7a20;
      QByteArray::QByteArray((QByteArray *)&local_58,"GL_ARB_compatibility",-1);
      bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensions,(QByteArray *)&local_58);
      bVar2 = true;
      if (bVar3) {
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        goto LAB_004d794a;
      }
    }
    else {
LAB_004d7a20:
      bVar2 = false;
    }
    local_a8.first = 3;
    local_a8.second = 2;
    bVar3 = std::operator>=((pair<int,_int> *)&local_88,&local_a8);
    if (bVar3) {
      OVar5 = QSurfaceFormat::profile(&format);
      if (bVar2) {
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
      if (OVar5 == CompatibilityProfile) goto LAB_004d794a;
    }
    else if (bVar2) {
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
  }
  QSurfaceFormat::~QSurfaceFormat(&format);
LAB_004d795a:
  QHash<QByteArray,_QHashDummyValue>::~QHash((QHash<QByteArray,_QHashDummyValue> *)&extensions);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar7;
}

Assistant:

static int qt_gl_resolve_features()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QOpenGLExtensionMatcher extensions;
    int features = 0;
    if ((extensions.match("GL_KHR_blend_equation_advanced")
        || extensions.match("GL_NV_blend_equation_advanced")) &&
        (extensions.match("GL_KHR_blend_equation_advanced_coherent")
        || extensions.match("GL_NV_blend_equation_advanced_coherent"))) {
        // We need both the advanced equations and the coherency for us
        // to be able to easily use the new blend equations
        features |= QOpenGLFunctions::BlendEquationAdvanced;
    }
    if (ctx->isOpenGLES()) {
        // OpenGL ES
        features |= QOpenGLFunctions::Multitexture |
            QOpenGLFunctions::Shaders |
            QOpenGLFunctions::Buffers |
            QOpenGLFunctions::Framebuffers |
            QOpenGLFunctions::BlendColor |
            QOpenGLFunctions::BlendEquation |
            QOpenGLFunctions::BlendEquationSeparate |
            QOpenGLFunctions::BlendFuncSeparate |
            QOpenGLFunctions::BlendSubtract |
            QOpenGLFunctions::CompressedTextures |
            QOpenGLFunctions::Multisample |
            QOpenGLFunctions::StencilSeparate;
        if (extensions.match("GL_IMG_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures;
        if (extensions.match("GL_OES_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        if (ctx->format().majorVersion() >= 3 || extensions.match("GL_EXT_texture_rg"))
            features |= QOpenGLFunctions::TextureRGFormats;
        if (ctx->format().majorVersion() >= 3) {
            features |= QOpenGLFunctions::MultipleRenderTargets;
            if (ctx->format().minorVersion() >= 2 && extensions.match("GL_KHR_blend_equation_advanced_coherent")) {
                // GL_KHR_blend_equation_advanced is included in OpenGL ES/3.2
                features |= QOpenGLFunctions::BlendEquationAdvanced;
            }
        }
        return features;
    } else {
        // OpenGL
        features |= QOpenGLFunctions::TextureRGFormats;
        QSurfaceFormat format = QOpenGLContext::currentContext()->format();

        if (format.majorVersion() >= 3)
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;
        else if (extensions.match("GL_EXT_framebuffer_object") || extensions.match("GL_ARB_framebuffer_object"))
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;

        if (format.majorVersion() >= 2) {
            features |= QOpenGLFunctions::BlendColor |
                QOpenGLFunctions::BlendEquation |
                QOpenGLFunctions::BlendSubtract |
                QOpenGLFunctions::Multitexture |
                QOpenGLFunctions::CompressedTextures |
                QOpenGLFunctions::Multisample |
                QOpenGLFunctions::BlendFuncSeparate |
                QOpenGLFunctions::Buffers |
                QOpenGLFunctions::Shaders |
                QOpenGLFunctions::StencilSeparate |
                QOpenGLFunctions::BlendEquationSeparate |
                QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        } else {
            // Recognize features by extension name.
            if (extensions.match("GL_ARB_multitexture"))
                features |= QOpenGLFunctions::Multitexture;
            if (extensions.match("GL_ARB_shader_objects"))
                features |= QOpenGLFunctions::Shaders;
            if (extensions.match("GL_EXT_blend_color"))
                features |= QOpenGLFunctions::BlendColor;
            if (extensions.match("GL_EXT_blend_equation_separate"))
                features |= QOpenGLFunctions::BlendEquationSeparate;
            if (extensions.match("GL_EXT_blend_subtract"))
                features |= QOpenGLFunctions::BlendSubtract;
            if (extensions.match("GL_EXT_blend_func_separate"))
                features |= QOpenGLFunctions::BlendFuncSeparate;
            if (extensions.match("GL_ARB_texture_compression"))
                features |= QOpenGLFunctions::CompressedTextures;
            if (extensions.match("GL_ARB_multisample"))
                features |= QOpenGLFunctions::Multisample;
            if (extensions.match("GL_ARB_texture_non_power_of_two"))
                features |= QOpenGLFunctions::NPOTTextures |
                    QOpenGLFunctions::NPOTTextureRepeat;
        }

        const std::pair<int, int> version = format.version();
        if (version < std::pair(3, 0)
            || (version == std::pair(3, 0) && format.testOption(QSurfaceFormat::DeprecatedFunctions))
            || (version == std::pair(3, 1) && extensions.match("GL_ARB_compatibility"))
            || (version >= std::pair(3, 2) && format.profile() == QSurfaceFormat::CompatibilityProfile)) {
            features |= QOpenGLFunctions::FixedFunctionPipeline;
        }
        return features;
    }
}